

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeCurves(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppCVar2;
  Curve *this_00;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  pointer ppCVar6;
  int i;
  int i_00;
  double dVar7;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[CURVES]\n");
  ppCVar2 = (this->network->curves).super__Vector_base<Curve_*,_std::allocator<Curve_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar6 = (this->network->curves).super__Vector_base<Curve_*,_std::allocator<Curve_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar6 != ppCVar2; ppCVar6 = ppCVar6 + 1
      ) {
    this_00 = *ppCVar6;
    if (*(int *)&(this_00->super_Element).field_0x2c != 0) {
      lVar3 = *(long *)&this->field_0x18;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(&this->field_0x30 + lVar4) =
           *(uint *)(&this->field_0x30 + lVar4) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0x10;
      poVar5 = std::operator<<((ostream *)puVar1,(string *)&(this_00->super_Element).name);
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = std::operator<<(poVar5,Curve::CurveTypeWords
                                      [*(int *)&(this_00->super_Element).field_0x2c]);
      std::operator<<(poVar5,"\n");
    }
    for (i_00 = 0;
        i_00 < (int)((ulong)((long)(this_00->xData).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this_00->xData).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
      poVar5 = std::operator<<((ostream *)puVar1,(string *)&(this_00->super_Element).name);
      std::operator<<(poVar5,"  ");
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      dVar7 = Curve::x(this_00,i_00);
      std::ostream::_M_insert<double>(dVar7);
      *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0xc;
      dVar7 = Curve::y(this_00,i_00);
      poVar5 = std::ostream::_M_insert<double>(dVar7);
      std::operator<<(poVar5,"\n");
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeCurves()
{
    fout << "\n[CURVES]\n";
    for (Curve* curve : network->curves)
    {
        if (curve->curveType() != Curve::UNKNOWN)
        {
            fout << left << setw(16) << curve->name << "  " <<
                Curve::CurveTypeWords[curve->curveType()] << "\n";
        }
        for (int i = 0; i < curve->size(); i++)
        {
            fout << setw(16) << curve->name << "  ";
            fout << setw(12) << curve->x(i);
            fout << setw(12) << curve->y(i) << "\n";
        }
    }
}